

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O1

bool __thiscall
GlobOpt::DoArrayCheckHoist(GlobOpt *this,ValueType baseValueType,Loop *loop,Instr *instr)

{
  bool bVar1;
  ImplicitCallFlags IVar2;
  ValueType local_22 [4];
  ValueType baseValueType_local;
  
  if (((this->field_0xf5 & 0x40) != 0) &&
     (((instr == (Instr *)0x0 || (this->prePassLoop != (Loop *)0x0)) ||
      (bVar1 = IR::Instr::DoStackArgsOpt(instr), !bVar1)))) {
    bVar1 = ValueType::IsLikelyArrayOrObjectWithArray(local_22);
    if ((!bVar1) && (bVar1 = ValueType::IsLikelyOptimizedVirtualTypedArray(local_22), !bVar1)) {
      return true;
    }
    if (loop == (Loop *)0x0) {
      IVar2 = this->func->m_fg->implicitCallFlags;
      if (IVar2 != ImplicitCall_HasNoInfo &&
          (IVar2 & ~ImplicitCall_Accessor) == ImplicitCall_HasNoInfo) {
        return true;
      }
    }
    else {
      bVar1 = ImplicitCallFlagsAllowOpts(loop);
      if (bVar1) {
        return true;
      }
    }
    if (loop == (Loop *)0x0) {
      IVar2 = this->func->m_fg->implicitCallFlags;
    }
    else {
      IVar2 = Loop::GetImplicitCallFlags(loop);
    }
    if (((IVar2 & ~ImplicitCall_External) == ImplicitCall_HasNoInfo) &&
       (bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,HostOptPhase), bVar1)) {
      Output::Print(L"DoArrayCheckHoist disabled for JS arrays because of external: ");
      Func::DumpFullFunctionName(this->func);
      Output::Print(L"\n");
      Output::Flush();
      return false;
    }
  }
  return false;
}

Assistant:

bool
GlobOpt::DoArrayCheckHoist(const ValueType baseValueType, Loop* loop, IR::Instr const * const instr) const
{
    if(!DoArrayCheckHoist() || (instr && !IsLoopPrePass() && instr->DoStackArgsOpt()))
    {
        return false;
    }

    // This includes typed arrays, but not virtual typed arrays, whose vtable can change if the buffer goes away.
    // Note that in the virtual case the vtable check is the only way to catch this, since there's no bound check.
    if(!(baseValueType.IsLikelyArrayOrObjectWithArray() || baseValueType.IsLikelyOptimizedVirtualTypedArray()) ||
        (loop ? ImplicitCallFlagsAllowOpts(loop) : ImplicitCallFlagsAllowOpts(func)))
    {
        return true;
    }

    // The function or loop does not allow disabling implicit calls, which is required to eliminate redundant JS array checks
#if DBG_DUMP
    if((((loop ? loop->GetImplicitCallFlags() : func->m_fg->implicitCallFlags) & ~Js::ImplicitCall_External) == 0) &&
        Js::Configuration::Global.flags.Trace.IsEnabled(Js::HostOptPhase))
    {
        Output::Print(_u("DoArrayCheckHoist disabled for JS arrays because of external: "));
        func->DumpFullFunctionName();
        Output::Print(_u("\n"));
        Output::Flush();
    }
#endif
    return false;
}